

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatToTest_FormatToNonbackInsertIteratorWithSignAndNumericAlignment_Test::TestBody
          (FormatToTest_FormatToNonbackInsertIteratorWithSignAndNumericAlignment_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *in_RDI;
  char *unaff_retaddr;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  char buffer [16];
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffffac;
  int line;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [7];
  char *in_stack_ffffffffffffffd0;
  char local_18 [8];
  char *actual;
  
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  actual = (char *)0x0;
  fmt::v5::internal::make_checked<char>(local_18,0x10);
  fmt::v5::format_to<char*,char[7],double>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(double *)in_stack_ffffffffffffffc0
            );
  this_01 = (AssertionResult *)&stack0xffffffffffffffd0;
  testing::internal::CmpHelperSTREQ((char *)in_stack_00000008,unaff_retaddr,in_RDI,actual);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffac);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12cbc9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,line,
               &this_01->success_);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12cc17);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cc57);
  return;
}

Assistant:

TEST(FormatToTest, FormatToNonbackInsertIteratorWithSignAndNumericAlignment) {
  char buffer[16] = {};
  fmt::format_to(fmt::internal::make_checked(buffer, 16), "{: =+}", 42.0);
  EXPECT_STREQ("+42", buffer);
}